

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O0

bool __thiscall
Clasp::PBBuilder::addConstraint
          (PBBuilder *this,WeightLitVec *lits,weight_t bound,bool eq,weight_t cw)

{
  WeightLiteral x;
  WeightLiteral x_00;
  bool bVar1;
  size_type sVar2;
  Literal LVar3;
  reference ppVar4;
  Literal in_EDX;
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
  *in_RSI;
  ProgramBuilder *in_RDI;
  int in_R8D;
  Var eqVar;
  Literal *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  Literal in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  CPair local_58;
  Literal local_48;
  pair<Clasp::Literal,_int> local_44;
  uint32 local_3c;
  uint32 in_stack_ffffffffffffffc8;
  Literal in_stack_ffffffffffffffcc;
  pair<Clasp::Literal,_int> in_stack_ffffffffffffffd0;
  uint32 uVar5;
  bool local_1;
  
  ProgramBuilder::ctx(in_RDI);
  bVar1 = SharedContext::ok((SharedContext *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (bVar1) {
    uVar5 = 0;
    if (0 < in_R8D) {
      sVar2 = bk_lib::
              pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
              ::size(in_RSI);
      if (sVar2 == 1) {
        ppVar4 = bk_lib::
                 pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                 ::operator[](in_RSI,0);
        if (ppVar4->second < 0) {
          ppVar4 = bk_lib::
                   pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                   ::operator[](in_RSI,0);
          in_stack_ffffffffffffff94 = -ppVar4->second;
          ppVar4 = bk_lib::
                   pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                   ::operator[](in_RSI,0);
          ppVar4->second = in_stack_ffffffffffffff94;
          in_EDX.rep_ = in_stack_ffffffffffffff94 + in_EDX.rep_;
          bk_lib::
          pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
          ::operator[](in_RSI,0);
          LVar3 = Literal::operator~(in_stack_ffffffffffffff88);
          ppVar4 = bk_lib::
                   pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                   ::operator[](in_RSI,0);
          (ppVar4->first).rep_ = LVar3.rep_;
        }
        ppVar4 = bk_lib::
                 pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                 ::operator[](in_RSI,0);
        if (ppVar4->second < (int)in_EDX.rep_) {
          local_3c = (uint32)lit_false();
          ppVar4 = bk_lib::
                   pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                   ::operator[](in_RSI,0);
          (ppVar4->first).rep_ = local_3c;
        }
        bk_lib::
        pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
        ::operator[](in_RSI,0);
        local_48 = Literal::operator~(in_stack_ffffffffffffff88);
        std::pair<Clasp::Literal,_int>::pair<Clasp::Literal,_int_&,_true>
                  (&local_44,&local_48,(int *)&stack0xffffffffffffffdc);
        x_00.second = in_stack_ffffffffffffffa4;
        x_00.first.rep_ = in_stack_ffffffffffffffa0.rep_;
        ProgramBuilder::addMinLit(in_RDI,in_stack_ffffffffffffff94,x_00);
        return true;
      }
      uVar5 = getAuxVar((PBBuilder *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      in_stack_ffffffffffffffcc = negLit(0x1cb47d);
      std::pair<Clasp::Literal,_int>::pair<Clasp::Literal,_int_&,_true>
                ((pair<Clasp::Literal,_int> *)&stack0xffffffffffffffd0,
                 (Literal *)&stack0xffffffffffffffcc,(int *)&stack0xffffffffffffffdc);
      x.second = in_stack_ffffffffffffffa4;
      x.first.rep_ = in_stack_ffffffffffffffa0.rep_;
      ProgramBuilder::addMinLit(in_RDI,in_stack_ffffffffffffff94,x);
    }
    ProgramBuilder::ctx(in_RDI);
    SharedContext::master((SharedContext *)0x1cb5a5);
    posLit(0x1cb5b2);
    local_58 = WeightConstraint::create
                         ((Solver *)CONCAT44(in_R8D,uVar5),in_EDX,
                          (WeightLitVec *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc.rep_,
                          in_stack_ffffffffffffffc8);
    local_1 = WeightConstraint::CPair::ok(&local_58);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool PBBuilder::addConstraint(WeightLitVec& lits, weight_t bound, bool eq, weight_t cw) {
	if (!ctx()->ok()) { return false; }
	Var eqVar = 0;
	if (cw > 0) { // soft constraint
		if (lits.size() != 1) {
			eqVar = getAuxVar();
			addMinLit(0, WeightLiteral(negLit(eqVar), cw));
		}
		else {
			if (lits[0].second < 0)    { bound += (lits[0].second = -lits[0].second); lits[0].first = ~lits[0].first; }
			if (lits[0].second < bound){ lits[0].first = lit_false(); }
			addMinLit(0, WeightLiteral(~lits[0].first, cw));
			return true;
		}
	}
	return WeightConstraint::create(*ctx()->master(), posLit(eqVar), lits, bound, !eq ? 0 : WeightConstraint::create_eq_bound).ok();
}